

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O2

int If_ManCutAigDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  int iVar1;
  If_Obj_t *Entry;
  void *pvVar2;
  ulong uVar3;
  int i;
  
  p->vVisited->nSize = 0;
  for (uVar3 = 0; uVar3 < (byte)pCut->field_0x1f; uVar3 = uVar3 + 1) {
    Entry = If_ManObj(p,(int)(&pCut[1].Area)[uVar3]);
    if (Entry == (If_Obj_t *)0x0) break;
    if ((*(uint *)Entry >> 9 & 1) != 0) {
      __assert_fail("pLeaf->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x49,"int If_ManCutAigDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
    }
    *(uint *)Entry = *(uint *)Entry | 0x200;
    Vec_PtrPush(p->vVisited,Entry);
    (Entry->field_22).iCopy = (int)(Entry->CutBest).Delay;
  }
  iVar1 = If_ManCutAigDelay_rec(p,pObj,p->vVisited);
  for (i = 0; i < p->vVisited->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vVisited,i);
    *(byte *)((long)pvVar2 + 1) = *(byte *)((long)pvVar2 + 1) & 0xfd;
  }
  return iVar1;
}

Assistant:

int If_ManCutAigDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, Delay;
    Vec_PtrClear( p->vVisited );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->fVisit == 0 );
        pLeaf->fVisit = 1;
        Vec_PtrPush( p->vVisited, pLeaf );
        pLeaf->iCopy = If_ObjCutBest(pLeaf)->Delay;
    }
    Delay = If_ManCutAigDelay_rec( p, pObj, p->vVisited );
    Vec_PtrForEachEntry( If_Obj_t *, p->vVisited, pLeaf, i )
        pLeaf->fVisit = 0;
//    assert( Delay <= (int)pObj->Level );
    return Delay;
}